

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testOptimized.cpp
# Opt level: O0

void anon_unknown.dwarf_1c5214::validatePixels
               (int *pImageHeight,int *pImageWidth,Array2D<Imath_3_2::half> *pPixels,int pNbChannels
               ,bool pIsLeft)

{
  half *phVar1;
  ostream *poVar2;
  int in_ECX;
  Array2D<Imath_3_2::half> *in_RDX;
  int *in_RSI;
  int *in_RDI;
  byte in_R8B;
  half rgbaValue [4];
  int retVal;
  int j;
  int i;
  ostream *in_stack_ffffffffffffffb0;
  ostream *in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  half hVar3;
  half local_34;
  half local_32;
  half local_30;
  int local_2c;
  int local_28;
  int local_24;
  byte local_1d;
  int local_1c;
  Array2D<Imath_3_2::half> *local_18;
  int *local_10;
  int *local_8;
  
  local_1d = in_R8B & 1;
  local_24 = 0;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  do {
    if (*local_8 <= local_24) {
      return;
    }
    for (local_28 = 0; local_28 < *local_10; local_28 = local_28 + 1) {
      local_2c = 0xffffffff;
      generatePixel(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0,
                    (half *)in_stack_ffffffffffffffb8,
                    SUB81((ulong)in_stack_ffffffffffffffb0 >> 0x38,0));
      phVar1 = Imf_3_2::Array2D<Imath_3_2::half>::operator[](local_18,(long)local_24);
      local_2c = memcmp(phVar1 + local_28 * local_1c,&local_34,(long)local_1c << 1);
      if (local_2c != 0) {
        poVar2 = std::operator<<((ostream *)&std::cout,"ERROR at pixel [");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_24);
        poVar2 = std::operator<<(poVar2,";");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_28);
        poVar2 = std::operator<<(poVar2,"]");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        poVar2 = std::operator<<((ostream *)&std::cout,"\tExpected [");
        poVar2 = (ostream *)::operator<<(poVar2,local_34);
        poVar2 = std::operator<<(poVar2,", ");
        poVar2 = (ostream *)::operator<<(poVar2,local_32);
        poVar2 = std::operator<<(poVar2,", ");
        hVar3._h = local_30._h;
        poVar2 = (ostream *)::operator<<(poVar2,local_30);
        poVar2 = std::operator<<(poVar2,"] ");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        poVar2 = std::operator<<((ostream *)&std::cout,"\tReceived [");
        phVar1 = Imf_3_2::Array2D<Imath_3_2::half>::operator[](local_18,(long)local_24);
        in_stack_ffffffffffffffc4 = CONCAT22(hVar3._h,phVar1[local_28 * local_1c]._h);
        poVar2 = (ostream *)::operator<<(poVar2,(half)phVar1[local_28 * local_1c]._h);
        in_stack_ffffffffffffffb0 = std::operator<<(poVar2,", ");
        phVar1 = Imf_3_2::Array2D<Imath_3_2::half>::operator[](local_18,(long)local_24);
        hVar3._h = phVar1[local_28 * local_1c + 1]._h;
        poVar2 = (ostream *)::operator<<(in_stack_ffffffffffffffb0,hVar3);
        in_stack_ffffffffffffffb8 = std::operator<<(poVar2,", ");
        phVar1 = Imf_3_2::Array2D<Imath_3_2::half>::operator[](local_18,(long)local_24);
        in_stack_ffffffffffffffc0 = CONCAT22(hVar3._h,phVar1[local_28 * local_1c + 2]._h);
        poVar2 = (ostream *)
                 ::operator<<(in_stack_ffffffffffffffb8,(half)phVar1[local_28 * local_1c + 2]._h);
        poVar2 = std::operator<<(poVar2,"]");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        if (local_2c != 0) {
          __assert_fail("retVal == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testOptimized.cpp"
                        ,0xb8,
                        "void (anonymous namespace)::validatePixels(const int &, const int &, Array2D<half> &, int, bool)"
                       );
        }
      }
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

void
validatePixels (
    const int&     pImageHeight,
    const int&     pImageWidth,
    Array2D<half>& pPixels,
    int            pNbChannels,
    bool           pIsLeft)
{
    for (int i = 0; i < pImageHeight; ++i)
    {
        for (int j = 0; j < pImageWidth; ++j)
        {
            int  retVal = -1;
            half rgbaValue[4];
            generatePixel (i, j, &rgbaValue[0], pIsLeft);

            retVal = memcmp (
                (void*) &pPixels[i][j * pNbChannels],
                (void*) &rgbaValue[0],
                pNbChannels * sizeof (half));

            if (retVal != 0)
            {
                cout << "ERROR at pixel [" << i << ";" << j << "]" << endl;
                cout << "\tExpected [" << rgbaValue[0] << ", " << rgbaValue[1]
                     << ", " << rgbaValue[2] << "] " << endl;

                cout << "\tReceived [" << pPixels[i][j * pNbChannels] << ", "
                     << pPixels[i][j * pNbChannels + 1] << ", "
                     << pPixels[i][j * pNbChannels + 2] << "]" << endl;
                assert (retVal == 0);
            }
        }
    }
}